

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderManager.cpp
# Opt level: O0

LayerHandle __thiscall Rml::RenderManager::GetNextLayer(RenderManager *this)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  value_type local_20;
  RenderManager *this_local;
  
  bVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->render_stack);
  if ((bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(!render_stack.empty())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/RenderManager.cpp"
                     ,0x155), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->render_stack);
  if (sVar3 < 2) {
    local_20 = 0;
  }
  else {
    sVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->render_stack);
    pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->render_stack,sVar3 - 2);
    local_20 = *pvVar4;
  }
  return local_20;
}

Assistant:

LayerHandle RenderManager::GetNextLayer() const
{
	RMLUI_ASSERT(!render_stack.empty());
	return render_stack.size() < 2 ? LayerHandle{} : render_stack[render_stack.size() - 2];
}